

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first.c
# Opt level: O2

char * hexdump(uchar *buffer,size_t len)

{
  size_t sVar1;
  char *pcVar2;
  
  if (200 < len) {
    return (char *)0x0;
  }
  pcVar2 = hexdump::dump;
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    curl_msnprintf(pcVar2,4,"%02x ",buffer[sVar1]);
    pcVar2 = pcVar2 + 3;
  }
  return hexdump::dump;
}

Assistant:

char *hexdump(unsigned char *buffer, size_t len)
{
  static char dump[200*3+1];
  char *p = dump;
  size_t i;
  if(len > 200)
    return NULL;
  for(i=0; i<len; i++, p += 3)
    snprintf(p, 4, "%02x ", buffer[i]);
  return dump;
}